

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O3

void __thiscall
dynamicgraph::TracerRealTime::openFile(TracerRealTime *this,SignalBase<int> *sig,string *givenname)

{
  size_t *psVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  ExceptionTraces *this_00;
  size_type *psVar5;
  string filename;
  string signame;
  ErrorCodeEnum local_d4;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (givenname->_M_string_length == 0) {
    SignalBase<int>::shortName_abi_cxx11_(&local_d0,sig);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x128);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,*(ulong *)&this->field_0x148);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = (_List_node_base *)operator_new(0x200);
  std::ofstream::ofstream((ofstream *)p_Var3,local_d0._M_dataplus._M_p,_S_out);
  if (*(int *)((long)&p_Var3[2]._M_next + (long)p_Var3->_M_next[-2]._M_prev) == 0) {
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(this->hardFiles).
              super__List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var3 = (_List_node_base *)operator_new(0x1b8);
    OutStringStream::OutStringStream((OutStringStream *)p_Var3);
    local_b0._M_dataplus._M_p = (pointer)(long)this->bufferSize;
    OutStringStream::resize((OutStringStream *)p_Var3,(streamsize *)&local_b0);
    std::__cxx11::string::_M_assign((string *)(p_Var3 + 9));
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    *(long *)&this->field_0x1a0 = *(long *)&this->field_0x1a0 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  (*(code *)p_Var3->_M_next->_M_prev)(p_Var3);
  this_00 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
  local_d4 = NOT_OPEN;
  std::operator+(&local_50,"Could not open file ",&local_d0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90._M_dataplus._M_p = (pointer)*plVar2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar5) {
    local_90.field_2._M_allocated_capacity = *psVar5;
    local_90.field_2._8_8_ = plVar2[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar5;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_b0,&local_90,&local_70);
  dynamicgraph::ExceptionTraces::ExceptionTraces(this_00,&local_d4,(string *)&local_b0,"");
  __cxa_throw(this_00,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

void TracerRealTime::openFile(const SignalBase<int> &sig,
                              const std::string &givenname) {
  dgDEBUGIN(15);
  string signame;
  if (givenname.length()) {
    signame = givenname;
  } else {
    signame = sig.shortName();
  }

  string filename = rootdir + basename + signame + suffix;
  dgDEBUG(5) << "Sig <" << sig.getName() << ">: new file " << filename << endl;
  std::ofstream *newfile = new std::ofstream(filename.c_str());
  if (!newfile->good()) {
    delete newfile;
    DG_THROW ExceptionTraces(
        ExceptionTraces::NOT_OPEN,
        "Could not open file " + filename + " for signal " + signame, "");
  }
  dgDEBUG(5) << "Newfile:" << (void *)newfile << endl;
  hardFiles.push_back(newfile);
  dgDEBUG(5) << "Creating Outstringstream" << endl;

  // std::stringstream * newbuffer = new std::stringstream ();
  OutStringStream *newbuffer = new OutStringStream();  // std::stringstream ();
  newbuffer->resize(bufferSize);
  newbuffer->givenname = givenname;
  files.push_back(newbuffer);

  dgDEBUGOUT(15);
}